

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O2

int array_negation_range_test(int r_start,int r_end,_Bool is_bitset)

{
  uint16_t val;
  _Bool _Var1;
  _Bool _Var2;
  short sVar3;
  int extraout_EAX;
  array_container_t *src;
  undefined7 in_register_00000011;
  uint8_t type;
  int x;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  container_t *BO;
  int local_40;
  undefined4 local_3c;
  array_container_t *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,is_bitset);
  src = array_container_create();
  for (uVar4 = 0; uVar4 < 0x10000; uVar4 = uVar4 + 0x1d) {
    array_container_add(src,(uint16_t)uVar4);
  }
  uVar5 = 0;
  for (uVar4 = 0; uVar4 != 0x10000; uVar4 = uVar4 + 1) {
    sVar3 = (short)((uVar4 & 0xffff) / 0x1d) * -0x1d + (short)uVar4;
    if ((int)uVar4 < r_end && r_start <= (int)uVar4) {
      bVar6 = sVar3 != 0;
    }
    else {
      bVar6 = sVar3 == 0;
    }
    uVar5 = uVar5 + bVar6;
  }
  local_38 = src;
  _Var1 = array_container_negation_range(src,r_start,r_end,&BO);
  type = '\x02' - _Var1;
  local_40 = container_get_cardinality(BO,'\x02' - _Var1);
  _assert_int_equal((ulong)(byte)local_3c,(ulong)_Var1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x596);
  _assert_int_equal((ulong)uVar5,(long)local_40,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x597);
  for (uVar4 = 0; uVar4 != 0x10000; uVar4 = uVar4 + 1) {
    val = (uint16_t)uVar4;
    sVar3 = (short)((uVar4 & 0xffff) / 0x1d) * -0x1d + val;
    if ((int)uVar4 < r_end && r_start <= (int)uVar4) {
      _Var1 = sVar3 != 0;
    }
    else {
      _Var1 = sVar3 == 0;
    }
    _Var2 = container_contains(BO,val,type);
    if (_Var1 != _Var2) {
      printf("oops on %d\n",(ulong)uVar4);
    }
    _Var2 = container_contains(BO,val,type);
    _assert_int_equal((ulong)_Var2,(ulong)_Var1,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                      ,0x5a6);
  }
  container_free(BO,type);
  array_container_free(local_38);
  return extraout_EAX;
}

Assistant:

static int array_negation_range_test(int r_start, int r_end, bool is_bitset) {
    bool result_is_bitset;
    int result_size_should_be = 0;

    array_container_t* AI = array_container_create();
    container_t* BO;  // bitset or array

    for (int x = 0; x < (1 << 16); x += 29) {
        array_container_add(AI, (uint16_t)x);
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x >= r_start && x < r_end)
            if (x % 29 != 0)
                result_size_should_be++;
            else {
            }
        else if (x % 29 == 0)
            result_size_should_be++;
    }

    result_is_bitset = array_container_negation_range(AI, r_start, r_end, &BO);
    uint8_t result_typecode =
        (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);

    int result_card = container_get_cardinality(BO, result_typecode);

    assert_int_equal(is_bitset, result_is_bitset);
    assert_int_equal(result_size_should_be, result_card);

    for (int x = 0; x < (1 << 16); x++) {
        bool should_be_present;
        if (x >= r_start && x < r_end)
            should_be_present = (x % 29 != 0);
        else
            should_be_present = (x % 29 == 0);

#ifndef UNVERBOSE_MIXED_CONTAINER
        if (should_be_present !=
            container_contains(BO, (uint16_t)x, result_typecode))
            printf("oops on %d\n", x);
#endif
        assert_int_equal(container_contains(BO, (uint16_t)x, result_typecode),
                         should_be_present);
    }
    container_free(BO, result_typecode);
    array_container_free(AI);
    return 1;
}